

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SHA1_Hash *
Internal_FaceHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHashType hash_type,
                 ON_SubDFace *first_face,uint level_index,ON_SubDFaceIdIterator *fidit)

{
  ON_SubDFace *f;
  uint uVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFace *extraout_RDX;
  ON_SubDFace *extraout_RDX_00;
  ON_SubDFace *extraout_RDX_01;
  ON_SubDFace *extraout_RDX_02;
  undefined7 in_register_00000031;
  ON_SHA1 local_a8;
  
  local_a8.m_state[2] = 0;
  local_a8.m_state[3] = 0;
  local_a8.m_state[4] = 0;
  local_a8.m_bit_count[0] = 0;
  local_a8.m_bit_count[1] = 0;
  local_a8.m_state[0] = 0;
  local_a8.m_state[1] = 0;
  local_a8.m_buffer[0x30] = '\0';
  local_a8.m_buffer[0x31] = '\0';
  local_a8.m_buffer[0x32] = '\0';
  local_a8.m_buffer[0x33] = '\0';
  local_a8.m_buffer[0x34] = '\0';
  local_a8.m_buffer[0x35] = '\0';
  local_a8.m_buffer[0x36] = '\0';
  local_a8.m_buffer[0x37] = '\0';
  local_a8.m_buffer[0x38] = '\0';
  local_a8.m_buffer[0x39] = '\0';
  local_a8.m_buffer[0x3a] = '\0';
  local_a8.m_buffer[0x3b] = '\0';
  local_a8.m_buffer[0x3c] = '\0';
  local_a8.m_buffer[0x3d] = '\0';
  local_a8.m_buffer[0x3e] = '\0';
  local_a8.m_buffer[0x3f] = '\0';
  local_a8.m_buffer[0x20] = '\0';
  local_a8.m_buffer[0x21] = '\0';
  local_a8.m_buffer[0x22] = '\0';
  local_a8.m_buffer[0x23] = '\0';
  local_a8.m_buffer[0x24] = '\0';
  local_a8.m_buffer[0x25] = '\0';
  local_a8.m_buffer[0x26] = '\0';
  local_a8.m_buffer[0x27] = '\0';
  local_a8.m_buffer[0x28] = '\0';
  local_a8.m_buffer[0x29] = '\0';
  local_a8.m_buffer[0x2a] = '\0';
  local_a8.m_buffer[0x2b] = '\0';
  local_a8.m_buffer[0x2c] = '\0';
  local_a8.m_buffer[0x2d] = '\0';
  local_a8.m_buffer[0x2e] = '\0';
  local_a8.m_buffer[0x2f] = '\0';
  local_a8.m_buffer[0x10] = '\0';
  local_a8.m_buffer[0x11] = '\0';
  local_a8.m_buffer[0x12] = '\0';
  local_a8.m_buffer[0x13] = '\0';
  local_a8.m_buffer[0x14] = '\0';
  local_a8.m_buffer[0x15] = '\0';
  local_a8.m_buffer[0x16] = '\0';
  local_a8.m_buffer[0x17] = '\0';
  local_a8.m_buffer[0x18] = '\0';
  local_a8.m_buffer[0x19] = '\0';
  local_a8.m_buffer[0x1a] = '\0';
  local_a8.m_buffer[0x1b] = '\0';
  local_a8.m_buffer[0x1c] = '\0';
  local_a8.m_buffer[0x1d] = '\0';
  local_a8.m_buffer[0x1e] = '\0';
  local_a8.m_buffer[0x1f] = '\0';
  local_a8.m_buffer[0] = '\0';
  local_a8.m_buffer[1] = '\0';
  local_a8.m_buffer[2] = '\0';
  local_a8.m_buffer[3] = '\0';
  local_a8.m_buffer[4] = '\0';
  local_a8.m_buffer[5] = '\0';
  local_a8.m_buffer[6] = '\0';
  local_a8.m_buffer[7] = '\0';
  local_a8.m_buffer[8] = '\0';
  local_a8.m_buffer[9] = '\0';
  local_a8.m_buffer[10] = '\0';
  local_a8.m_buffer[0xb] = '\0';
  local_a8.m_buffer[0xc] = '\0';
  local_a8.m_buffer[0xd] = '\0';
  local_a8.m_buffer[0xe] = '\0';
  local_a8.m_buffer[0xf] = '\0';
  local_a8.m_byte_count = 0;
  local_a8.m_status_bits = 0;
  local_a8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_a8.m_sha1_hash);
  if (first_face != (ON_SubDFace *)0x0 && (int)CONCAT71(in_register_00000031,hash_type) != 0) {
    uVar1 = 0;
    pOVar2 = extraout_RDX;
    do {
      if ((first_face->super_ON_SubDComponentBase).m_id < uVar1) {
        ON_SHA1::Reset(&local_a8);
        pOVar2 = ON_SubDFaceIdIterator::FirstFace(fidit);
        f = extraout_RDX_01;
        while (pOVar2 != (ON_SubDFace *)0x0) {
          if ((((pOVar2->super_ON_SubDComponentBase).m_level == level_index) &&
              ((pOVar2->super_ON_SubDComponentBase).m_id != 0)) &&
             ((pOVar2->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
            Internal_AccumulateFaceHash(&local_a8,(ON_SubDHashType)pOVar2,f);
          }
          pOVar2 = ON_SubDFaceIdIterator::NextFace(fidit);
          f = extraout_RDX_02;
        }
        break;
      }
      Internal_AccumulateFaceHash(&local_a8,(ON_SubDHashType)first_face,pOVar2);
      uVar1 = (first_face->super_ON_SubDComponentBase).m_id;
      first_face = first_face->m_next_face;
      pOVar2 = extraout_RDX_00;
    } while (first_face != (ON_SubDFace *)0x0);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SHA1_Hash Internal_FaceHash(ON_SubDHashType hash_type, const ON_SubDFace* first_face, unsigned int level_index, ON_SubDFaceIdIterator& fidit)
{
  ON_SHA1 sha1;
  if (ON_SubDHashType::Unset != hash_type)
  {
    unsigned prev_id = 0;
    for (const ON_SubDFace* f = first_face; nullptr != f; f = f->m_next_face)
    {
      if (prev_id > f->m_id)
      {
        // must use slower fidit to get consistent results when complex editing juggles vertex order
        sha1.Reset();
        for (f = fidit.FirstFace(); nullptr != f; f = fidit.NextFace())
        {
          if (level_index == f->SubdivisionLevel() && f->IsActive())
            Internal_AccumulateFaceHash(sha1, hash_type, f);
        }
        break;
      }
      Internal_AccumulateFaceHash(sha1, hash_type, f);
      prev_id = f->m_id;
    }
  }
  return sha1.Hash();
}